

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

gc_heap_ptr<mjs::regexp_object> __thiscall
mjs::anon_unknown_35::cast_to_regexp(anon_unknown_35 *this,value *v)

{
  bool bVar1;
  value_type vVar2;
  object_ptr *p;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  gc_heap_ptr<mjs::regexp_object> gVar4;
  undefined1 local_28 [8];
  object_ptr o;
  value *v_local;
  
  o.super_gc_heap_ptr_untyped._8_8_ = v;
  vVar2 = value::type(v);
  if (vVar2 == object) {
    p = value::object_value((value *)o.super_gc_heap_ptr_untyped._8_8_);
    gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_28,p);
    bVar1 = gc_heap_ptr_untyped::has_type<mjs::regexp_object>((gc_heap_ptr_untyped *)local_28);
    if (bVar1) {
      gc_heap_ptr<mjs::regexp_object>::gc_heap_ptr<mjs::object,void,void>
                ((gc_heap_ptr<mjs::regexp_object> *)this,(gc_heap_ptr<mjs::object> *)local_28);
    }
    else {
      gc_heap_ptr<mjs::regexp_object>::gc_heap_ptr
                ((gc_heap_ptr<mjs::regexp_object> *)this,(nullptr_t)0x0);
    }
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_28);
    uVar3 = extraout_RDX_00;
  }
  else {
    gc_heap_ptr<mjs::regexp_object>::gc_heap_ptr
              ((gc_heap_ptr<mjs::regexp_object> *)this,(nullptr_t)0x0);
    uVar3 = extraout_RDX;
  }
  gVar4.super_gc_heap_ptr_untyped._8_8_ = uVar3;
  gVar4.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (gc_heap_ptr<mjs::regexp_object>)gVar4.super_gc_heap_ptr_untyped;
}

Assistant:

gc_heap_ptr<regexp_object> cast_to_regexp(const value& v) {
    if (v.type() != value_type::object) {
        return nullptr;
    }
    auto o = v.object_value();
    if (!o.has_type<regexp_object>()) {
        return nullptr;
    }
    return gc_heap_ptr<regexp_object>{o};
}